

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_207e331::UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test::
TestBody(UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Message *extraout_RDX;
  Message *extraout_RDX_00;
  Message *message;
  pointer *__ptr;
  InternalMetadata arena;
  char *message_00;
  string_view value;
  string_view value_00;
  TestNestedMessageRedaction unredacted_nested_proto;
  TestNestedMessageRedaction redacted_nested_proto;
  RedactedFields proto;
  string local_208;
  undefined2 local_1e8;
  char local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  AssertHelper local_1d0 [2];
  undefined1 local_1c0 [32];
  long local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined2 local_188;
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  RedactedFields local_130;
  
  proto2_unittest::RedactedFields::RedactedFields(&local_130,(Arena *)0x0);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_158,(Arena *)0x0);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_180,(Arena *)0x0);
  local_158[0x10] = local_158[0x10] | 1;
  if ((local_158._8_8_ & 1) != 0) {
    local_158._8_8_ = *(undefined8 *)(local_158._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = anon_var_dwarf_2186c23 + 0xf;
  value._M_len = 6;
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_158 + 0x18),value,(Arena *)local_158._8_8_);
  local_180[0x10] = local_180[0x10] | 1;
  if ((local_180._8_8_ & 1) != 0) {
    local_180._8_8_ = *(undefined8 *)(local_180._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = anon_var_dwarf_2186c23 + 0xf;
  value_00._M_len = 6;
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_180 + 0x18),value_00,(Arena *)local_180._8_8_);
  local_130.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_130.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 8;
  if (local_130.field_0._impl_.optional_redacted_message_ == (TestNestedMessageRedaction *)0x0) {
    arena.ptr_ = local_130.super_Message.super_MessageLite._internal_metadata_.ptr_;
    if ((local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena.ptr_ = *(undefined8 *)
                    (local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                    0xfffffffffffffffe);
    }
    local_130.field_0._impl_.optional_redacted_message_ =
         (TestNestedMessageRedaction *)
         google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestNestedMessageRedaction>
                   ((Arena *)arena.ptr_);
  }
  proto2_unittest::TestNestedMessageRedaction::CopyFrom
            (local_130.field_0._impl_.optional_redacted_message_,
             (TestNestedMessageRedaction *)local_158);
  local_130.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_130.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0x10;
  if (local_130.field_0._impl_.optional_unredacted_message_ == (TestNestedMessageRedaction *)0x0) {
    if ((local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_130.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe
            );
    }
    local_130.field_0._impl_.optional_unredacted_message_ =
         (TestNestedMessageRedaction *)
         google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestNestedMessageRedaction>
                   ((Arena *)local_130.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  proto2_unittest::TestNestedMessageRedaction::CopyFrom
            (local_130.field_0._impl_.optional_unredacted_message_,
             (TestNestedMessageRedaction *)local_180);
  testing::StrEq<char[155]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_1c0 + 0x18),&anon_var_dwarf_20836a3);
  paVar1 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1c0._24_8_,(char *)(local_1c0._24_8_ + local_1a0));
  local_1e8 = local_188;
  local_1d0[0].data_ = (AssertHelperData *)local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  local_1c0._16_2_ = local_1e8;
  message = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    message = extraout_RDX_00;
  }
  google::protobuf::util::UnredactedUtf8DebugFormatForTest_abi_cxx11_
            (&local_208,(util *)&local_130,message);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
  ::operator()(local_1e0,(char *)local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "UnredactedUtf8DebugFormatForTest(proto)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0[0].data_ != (AssertHelperData *)local_1c0) {
    operator_delete(local_1d0[0].data_,local_1c0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._24_8_ != &local_198) {
    operator_delete((void *)local_1c0._24_8_,local_198._M_allocated_capacity + 1);
  }
  if (local_1e0[0] == '\0') {
    testing::Message::Message((Message *)&local_208);
    if (local_1d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a22956 + 5;
    }
    else {
      message_00 = (local_1d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unredacted_debug_format_for_test_test.cc"
               ,0x44,message_00);
    testing::internal::AssertHelper::operator=(local_1d0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_208._M_dataplus._M_p + 8))();
    }
  }
  if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,local_1d8);
  }
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_180);
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction
            ((TestNestedMessageRedaction *)local_158);
  proto2_unittest::RedactedFields::~RedactedFields(&local_130);
  return;
}

Assistant:

TEST(UnredactedDebugFormatAPITest, MessageUnredactedUtf8DebugFormat) {
  proto2_unittest::RedactedFields proto;
  proto2_unittest::TestNestedMessageRedaction redacted_nested_proto;
  proto2_unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  unredacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;

  EXPECT_THAT(UnredactedUtf8DebugFormatForTest(proto),
              StrEq("optional_redacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"
                    "optional_unredacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"));
}